

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testMultiPartThreading.cpp
# Opt level: O2

void __thiscall anon_unknown.dwarf_1d7349::RandomReadingTask::execute(RandomReadingTask *this)

{
  int pixelType;
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int width;
  int height;
  int iVar5;
  int iVar6;
  int iVar7;
  pthread_mutex_t *__mutex;
  long lVar8;
  TiledInputPart part;
  Box2i b1;
  Box2i b2;
  Array2D<Imath_3_2::half> hData;
  Array2D<float> fData;
  Array2D<unsigned_int> uData;
  FrameBuffer frameBuffer;
  
  iVar2 = random_int((int)((DAT_001d7c30 - (anonymous_namespace)::headers) / 0x38));
  lVar8 = (long)iVar2;
  pixelType = *(int *)((anonymous_namespace)::pixelTypes + lVar8 * 4);
  uData._data = (uint *)0x0;
  fData._data = (float *)0x0;
  hData._data = (half *)0x0;
  uData._sizeX = 0;
  uData._sizeY = 0;
  fData._sizeX = 0;
  fData._sizeY = 0;
  hData._sizeX = 0;
  hData._sizeY = 0;
  if (*(int *)((anonymous_namespace)::partTypes + lVar8 * 4) == 0) {
    iVar4 = random_int(0x107);
    iVar5 = random_int(0x107);
    iVar3 = iVar5;
    if (iVar5 < iVar4) {
      iVar3 = iVar4;
    }
    if (iVar4 < iVar5) {
      iVar5 = iVar4;
    }
    Imf_3_2::InputPart::InputPart((InputPart *)&b1,this->file,iVar2);
    __mutex = (pthread_mutex_t *)((anonymous_namespace)::mutexes + lVar8 * 0x28);
    std::mutex::lock((mutex *)&__mutex->__data);
    frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header;
    frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    setInputFrameBuffer(&frameBuffer,pixelType,&uData,&fData,&hData,0xc5,0x107);
    Imf_3_2::InputPart::setFrameBuffer((FrameBuffer *)&b1);
    Imf_3_2::InputPart::readPixels((int)&b1,iVar5);
    if (pixelType == 0) {
      bVar1 = checkPixels<unsigned_int>(&uData,0,0xc4,iVar5,iVar3,0xc5);
      if (!bVar1) {
        __assert_fail("checkPixels<unsigned int> ( uData, 0, width - 1, l1, l2, width)",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testMultiPartThreading.cpp"
                      ,0x12f,"virtual void (anonymous namespace)::RandomReadingTask::execute()");
      }
    }
    else if (pixelType == 1) {
      bVar1 = checkPixels<float>(&fData,0,0xc4,iVar5,iVar3,0xc5);
      if (!bVar1) {
        __assert_fail("checkPixels<float> ( fData, 0, width - 1, l1, l2, width)",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testMultiPartThreading.cpp"
                      ,0x133,"virtual void (anonymous namespace)::RandomReadingTask::execute()");
      }
    }
    else if ((pixelType == 2) &&
            (bVar1 = checkPixels<Imath_3_2::half>(&hData,0,0xc4,iVar5,iVar3,0xc5), !bVar1)) {
      __assert_fail("checkPixels<half> (hData, 0, width - 1, l1, l2, width)",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testMultiPartThreading.cpp"
                    ,0x137,"virtual void (anonymous namespace)::RandomReadingTask::execute()");
    }
    std::
    _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
    ::~_Rb_tree((_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
                 *)&frameBuffer);
  }
  else {
    Imf_3_2::TiledInputPart::TiledInputPart(&part,this->file,iVar2);
    __mutex = (pthread_mutex_t *)((anonymous_namespace)::mutexes + lVar8 * 0x28);
    std::mutex::lock((mutex *)&__mutex->__data);
    iVar2 = Imf_3_2::TiledInputPart::numXLevels();
    iVar3 = Imf_3_2::TiledInputPart::numYLevels();
    iVar4 = random_int(iVar2);
    random_int(iVar3);
    width = Imf_3_2::TiledInputPart::levelWidth((int)&part);
    height = Imf_3_2::TiledInputPart::levelHeight((int)&part);
    iVar2 = Imf_3_2::TiledInputPart::numXTiles((int)&part);
    iVar5 = Imf_3_2::TiledInputPart::numYTiles((int)&part);
    iVar6 = random_int(iVar2);
    iVar3 = random_int(iVar2);
    iVar7 = random_int(iVar5);
    iVar5 = random_int(iVar5);
    iVar2 = iVar3;
    if (iVar6 < iVar3) {
      iVar2 = iVar6;
    }
    if (iVar3 < iVar6) {
      iVar3 = iVar6;
    }
    iVar6 = iVar5;
    if (iVar7 < iVar5) {
      iVar6 = iVar7;
    }
    if (iVar5 < iVar7) {
      iVar5 = iVar7;
    }
    frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header;
    frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    setInputFrameBuffer(&frameBuffer,pixelType,&uData,&fData,&hData,width,height);
    Imf_3_2::TiledInputPart::setFrameBuffer((FrameBuffer *)&part);
    Imf_3_2::TiledInputPart::readTiles((int)&part,iVar2,iVar3,iVar6,iVar5,iVar4);
    Imf_3_2::TiledInputPart::dataWindowForTile((int)&b1,(int)&part,iVar2,iVar6);
    Imf_3_2::TiledInputPart::dataWindowForTile((int)&b2,(int)&part,iVar3,iVar5);
    if (pixelType == 0) {
      bVar1 = checkPixels<unsigned_int>(&uData,b1.min.x,b2.max.x,b1.min.y,b2.max.y,width);
      if (!bVar1) {
        __assert_fail("checkPixels<unsigned int> ( uData, b1.min.x, b2.max.x, b1.min.y, b2.max.y, w)"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testMultiPartThreading.cpp"
                      ,0x168,"virtual void (anonymous namespace)::RandomReadingTask::execute()");
      }
    }
    else if (pixelType == 1) {
      bVar1 = checkPixels<float>(&fData,b1.min.x,b2.max.x,b1.min.y,b2.max.y,width);
      if (!bVar1) {
        __assert_fail("checkPixels<float> ( fData, b1.min.x, b2.max.x, b1.min.y, b2.max.y, w)",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testMultiPartThreading.cpp"
                      ,0x16c,"virtual void (anonymous namespace)::RandomReadingTask::execute()");
      }
    }
    else if ((pixelType == 2) &&
            (bVar1 = checkPixels<Imath_3_2::half>(&hData,b1.min.x,b2.max.x,b1.min.y,b2.max.y,width),
            !bVar1)) {
      __assert_fail("checkPixels<half> ( hData, b1.min.x, b2.max.x, b1.min.y, b2.max.y, w)",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testMultiPartThreading.cpp"
                    ,0x170,"virtual void (anonymous namespace)::RandomReadingTask::execute()");
    }
    std::
    _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
    ::~_Rb_tree((_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
                 *)&frameBuffer);
  }
  pthread_mutex_unlock(__mutex);
  Imf_3_2::Array2D<Imath_3_2::half>::~Array2D(&hData);
  Imf_3_2::Array2D<float>::~Array2D(&fData);
  Imf_3_2::Array2D<unsigned_int>::~Array2D(&uData);
  return;
}

Assistant:

void execute ()
    {
        int partNumber = random_int (headers.size ());
        int partType   = partTypes[partNumber];
        int pixelType  = pixelTypes[partNumber];
        int levelMode  = levelModes[partNumber];

        Array2D<unsigned int> uData;
        Array2D<float>        fData;
        Array2D<half>         hData;
        if (partType == 0)
        {
            int l1, l2;
            l1 = random_int (height);
            l2 = random_int (height);
            if (l1 > l2) swap (l1, l2);

            InputPart part (*file, partNumber);
            //
            // We add lock here to assure that two threads that accessing
            // the same part won't mess things up.
            //
            std::lock_guard<std::mutex> lock (mutexes[partNumber]);

            FrameBuffer frameBuffer;
            setInputFrameBuffer (
                frameBuffer, pixelType, uData, fData, hData, width, height);

            part.setFrameBuffer (frameBuffer);
            part.readPixels (l1, l2);

            switch (pixelType)
            {
                case 0:
                    assert (checkPixels<unsigned int> (
                        uData, 0, width - 1, l1, l2, width));
                    break;
                case 1:
                    assert (checkPixels<float> (
                        fData, 0, width - 1, l1, l2, width));
                    break;
                case 2:
                    assert (
                        checkPixels<half> (hData, 0, width - 1, l1, l2, width));
                    break;
            }
        }
        else
        {
            int tx1, tx2, ty1, ty2;
            int lx, ly;

            TiledInputPart part (*file, partNumber);
            //
            // We add lock here to assure that two threads that accessing
            // the same part won't mess things up.
            //
            std::lock_guard<std::mutex> lock (mutexes[partNumber]);

            int numXLevels = part.numXLevels ();
            int numYLevels = part.numYLevels ();

            lx = random_int (numXLevels);
            ly = random_int (numYLevels);
            if (levelMode == 1) ly = lx;

            int w = part.levelWidth (lx);
            int h = part.levelHeight (ly);

            int numXTiles = part.numXTiles (lx);
            int numYTiles = part.numYTiles (ly);
            tx1           = random_int (numXTiles);
            tx2           = random_int (numXTiles);
            ty1           = random_int (numYTiles);
            ty2           = random_int (numYTiles);
            if (tx1 > tx2) swap (tx1, tx2);
            if (ty1 > ty2) swap (ty1, ty2);

            FrameBuffer frameBuffer;
            setInputFrameBuffer (
                frameBuffer, pixelType, uData, fData, hData, w, h);

            part.setFrameBuffer (frameBuffer);
            part.readTiles (tx1, tx2, ty1, ty2, lx, ly);

            Box2i b1 = part.dataWindowForTile (tx1, ty1, lx, ly);
            Box2i b2 = part.dataWindowForTile (tx2, ty2, lx, ly);

            switch (pixelType)
            {
                case 0:
                    assert (checkPixels<unsigned int> (
                        uData, b1.min.x, b2.max.x, b1.min.y, b2.max.y, w));
                    break;
                case 1:
                    assert (checkPixels<float> (
                        fData, b1.min.x, b2.max.x, b1.min.y, b2.max.y, w));
                    break;
                case 2:
                    assert (checkPixels<half> (
                        hData, b1.min.x, b2.max.x, b1.min.y, b2.max.y, w));
                    break;
            }
        }
    }